

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

void __thiscall xs::ExecutionRequestHandler::processSession(ExecutionRequestHandler *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  MessageType type;
  uint uVar4;
  deUint64 dVar5;
  ulong uVar6;
  deUint8 *data;
  TestDriver *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  nfds_t __nfds;
  ByteBuffer *in_RSI;
  int in_R8D;
  deUint64 curTime;
  deUint64 dStack_18;
  bool anyIO;
  deUint64 lastIoTime;
  ExecutionRequestHandler *this_local;
  
  this->m_run = true;
  dVar5 = deGetMicroseconds();
  while (dStack_18 = dVar5, (this->m_run & 1U) != 0) {
    bVar2 = receive(this);
    __n = CONCAT71((int7)(in_RCX >> 8),bVar2);
    uVar6 = send(this,(int)in_RSI,__buf,__n,in_R8D);
    in_RCX = CONCAT71((int7)(__n >> 8),(char)uVar6);
    bVar1 = true;
    if ((uVar6 & 1) == 0) {
      bVar1 = bVar2;
    }
    iVar3 = de::RingBuffer<unsigned_char>::getNumElements(&this->m_bufferIn);
    if (0 < iVar3) {
      in_RSI = &this->m_bufferIn;
      MessageBuilder::read(&this->m_msgBuilder,(int)in_RSI,__buf_00,in_RCX);
    }
    bVar2 = MessageBuilder::isComplete(&this->m_msgBuilder);
    if (bVar2) {
      type = MessageBuilder::getMessageType(&this->m_msgBuilder);
      data = MessageBuilder::getMessageData(&this->m_msgBuilder);
      in_RCX = MessageBuilder::getMessageDataSize(&this->m_msgBuilder);
      in_RSI = (ByteBuffer *)(ulong)type;
      processMessage(this,type,data,in_RCX);
      MessageBuilder::clear(&this->m_msgBuilder);
    }
    pollKeepAlives(this);
    bVar2 = bVar1;
    if (this->m_testDriver != (TestDriver *)0x0) {
      this_00 = getTestDriver(this);
      in_RSI = &this->m_bufferOut;
      uVar4 = TestDriver::poll(this_00,(pollfd *)in_RSI,__nfds,(int)in_RCX);
      in_RCX = in_RCX & 0xffffffffffffff00;
      bVar2 = true;
      if ((uVar4 & 1) == 0) {
        bVar2 = bVar1;
      }
    }
    dVar5 = deGetMicroseconds();
    if (!bVar2) {
      if (dVar5 - dStack_18 < 0x2711) {
        deYield();
        dVar5 = dStack_18;
      }
      else {
        deSleep(0x32);
        dVar5 = dStack_18;
      }
    }
  }
  return;
}

Assistant:

void ExecutionRequestHandler::processSession (void)
{
	m_run = true;

	deUint64 lastIoTime = deGetMicroseconds();

	while (m_run)
	{
		bool anyIO = false;

		// Read from socket to buffer.
		anyIO = receive() || anyIO;

		// Send bytes in buffer.
		anyIO = send() || anyIO;

		// Process incoming data.
		if (m_bufferIn.getNumElements() > 0)
		{
			DE_ASSERT(!m_msgBuilder.isComplete());
			m_msgBuilder.read(m_bufferIn);
		}

		if (m_msgBuilder.isComplete())
		{
			// Process message.
			processMessage(m_msgBuilder.getMessageType(), m_msgBuilder.getMessageData(), m_msgBuilder.getMessageDataSize());

			m_msgBuilder.clear();
		}

		// Keepalives, anyone?
		pollKeepAlives();

		// Poll test driver for IO.
		if (m_testDriver)
			anyIO = getTestDriver()->poll(m_bufferOut) || anyIO;

		// If no IO happens in a reasonable amount of time, go to sleep.
		{
			deUint64 curTime = deGetMicroseconds();
			if (anyIO)
				lastIoTime = curTime;
			else if (curTime-lastIoTime > SERVER_IDLE_THRESHOLD*1000)
				deSleep(SERVER_IDLE_SLEEP); // Too long since last IO, sleep for a while.
			else
				deYield(); // Just give other threads chance to run.
		}
	}
}